

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabFinishParse(Parse *pParse,Token *pEnd)

{
  Table *data;
  sqlite3 *db_00;
  int iDb_00;
  int iDest;
  char *pcVar1;
  Vdbe *p;
  void *pvVar2;
  char *zName;
  Schema *pSchema;
  Table *pOld;
  Vdbe *v;
  int iReg;
  int iDb;
  char *zWhere;
  char *zStmt;
  sqlite3 *db;
  Table *pTab;
  Token *pEnd_local;
  Parse *pParse_local;
  
  data = pParse->pNewTable;
  db_00 = pParse->db;
  if (data != (Table *)0x0) {
    addArgumentToVtab(pParse);
    (pParse->sArg).z = (char *)0x0;
    if (0 < data->nModuleArg) {
      if ((db_00->init).busy == '\0') {
        if (pEnd != (Token *)0x0) {
          (pParse->sNameToken).n = ((int)pEnd->z - (int)(pParse->sNameToken).z) + pEnd->n;
        }
        pcVar1 = sqlite3MPrintf(db_00,"CREATE VIRTUAL TABLE %T",&pParse->sNameToken);
        iDb_00 = sqlite3SchemaToIndex(db_00,data->pSchema);
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.%s SET type=\'table\', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q WHERE rowid=#%d"
                           ,db_00->aDb[iDb_00].zDbSName,"sqlite_master",data->zName,data->zName,
                           pcVar1,pParse->regRowid);
        sqlite3DbFree(db_00,pcVar1);
        p = sqlite3GetVdbe(pParse);
        sqlite3ChangeCookie(pParse,iDb_00);
        sqlite3VdbeAddOp0(p,0x97);
        pcVar1 = sqlite3MPrintf(db_00,"name=\'%q\' AND type=\'table\'",data->zName);
        sqlite3VdbeAddParseSchemaOp(p,iDb_00,pcVar1);
        iDest = pParse->nMem + 1;
        pParse->nMem = iDest;
        sqlite3VdbeLoadString(p,iDest,data->zName);
        sqlite3VdbeAddOp2(p,0x9a,iDb_00,iDest);
      }
      else {
        pvVar2 = sqlite3HashInsert(&data->pSchema->tblHash,data->zName,data);
        if (pvVar2 == (void *)0x0) {
          pParse->pNewTable = (Table *)0x0;
        }
        else {
          sqlite3OomFault(db_00);
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabFinishParse(Parse *pParse, Token *pEnd){
  Table *pTab = pParse->pNewTable;  /* The table being constructed */
  sqlite3 *db = pParse->db;         /* The database connection */

  if( pTab==0 ) return;
  addArgumentToVtab(pParse);
  pParse->sArg.z = 0;
  if( pTab->nModuleArg<1 ) return;
  
  /* If the CREATE VIRTUAL TABLE statement is being entered for the
  ** first time (in other words if the virtual table is actually being
  ** created now instead of just being read out of sqlite_master) then
  ** do additional initialization work and store the statement text
  ** in the sqlite_master table.
  */
  if( !db->init.busy ){
    char *zStmt;
    char *zWhere;
    int iDb;
    int iReg;
    Vdbe *v;

    /* Compute the complete text of the CREATE VIRTUAL TABLE statement */
    if( pEnd ){
      pParse->sNameToken.n = (int)(pEnd->z - pParse->sNameToken.z) + pEnd->n;
    }
    zStmt = sqlite3MPrintf(db, "CREATE VIRTUAL TABLE %T", &pParse->sNameToken);

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.  
    **
    ** The VM register number pParse->regRowid holds the rowid of an
    ** entry in the sqlite_master table tht was created for this vtab
    ** by sqlite3StartTable().
    */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='table', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      pTab->zName,
      pTab->zName,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    v = sqlite3GetVdbe(pParse);
    sqlite3ChangeCookie(pParse, iDb);

    sqlite3VdbeAddOp0(v, OP_Expire);
    zWhere = sqlite3MPrintf(db, "name='%q' AND type='table'", pTab->zName);
    sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere);

    iReg = ++pParse->nMem;
    sqlite3VdbeLoadString(v, iReg, pTab->zName);
    sqlite3VdbeAddOp2(v, OP_VCreate, iDb, iReg);
  }

  /* If we are rereading the sqlite_master table create the in-memory
  ** record of the table. The xConnect() method is not called until
  ** the first time the virtual table is used in an SQL statement. This
  ** allows a schema that contains virtual tables to be loaded before
  ** the required virtual table implementations are registered.  */
  else {
    Table *pOld;
    Schema *pSchema = pTab->pSchema;
    const char *zName = pTab->zName;
    assert( sqlite3SchemaMutexHeld(db, 0, pSchema) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, zName, pTab);
    if( pOld ){
      sqlite3OomFault(db);
      assert( pTab==pOld );  /* Malloc must have failed inside HashInsert() */
      return;
    }
    pParse->pNewTable = 0;
  }
}